

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void modify_account(int n)

{
  bool bVar1;
  long *plVar2;
  ostream *poVar3;
  char *pcVar4;
  bool bVar5;
  Account account;
  fstream File;
  char local_230 [16];
  byte abStack_220 [496];
  
  account._vptr_Account = (_func_int **)&PTR_create_account_00107c88;
  std::fstream::fstream(&File);
  std::fstream::open((char *)&File,0x10513d);
  if ((abStack_220[*(long *)(_File + -0x18)] & 5) == 0) {
    bVar1 = false;
    bVar5 = true;
    while( true ) {
      plVar2 = (long *)std::istream::read((char *)&File,(long)&account);
      if ((*(uint *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0 || bVar1) break;
      bVar1 = false;
      bVar5 = account.account_number != n;
      if (!bVar5) {
        Account::show_account(&account);
        poVar3 = std::operator<<((ostream *)&std::cout,"\n\n==>>Enter The New Details of Account");
        std::endl<char,std::char_traits<char>>(poVar3);
        Account::modify_account(&account);
        std::ostream::seekp((long)local_230,0xffffffe0);
        std::ostream::write(local_230,(long)&account);
        std::operator<<((ostream *)&std::cout,
                        "\n\n\n\n\n\n\n\n\n\n\n\n\n\n\n                   \t\t\t\t\t      Record Updated..\n\n     \t\t\t\t\t                     ==>>Press Enter<<=="
                       );
        bVar1 = true;
      }
    }
    std::fstream::close();
    if (!bVar5) goto LAB_00103bd1;
    pcVar4 = "\n\n Record Not Found ";
  }
  else {
    pcVar4 = "File could not be open !! Press any Key...";
  }
  std::operator<<((ostream *)&std::cout,pcVar4);
LAB_00103bd1:
  std::fstream::~fstream(&File);
  return;
}

Assistant:

void modify_account(int n)
{
    /*!
     * It modifies account with account number (n) regarding to the values entered
     * by the user
     */
    int found=0;
    Account account;
    std::fstream File;
    File.open("Account.dat",std::ios::binary|std::ios::in|std::ios::out);
    if(!File)
    {
        std::cout<<"File could not be open !! Press any Key...";
        return;
    }
    while(File.read((char *) &account, sizeof(Account)) && found==0)
    {
        if(account.return_account_num()==n)
        {
            account.show_account();
            std::cout<<"\n\n==>>Enter The New Details of Account"<<std::endl;
            account.modify_account();
            int pos=(-1)*sizeof(Account);
            File.seekp(pos,std::ios::cur);
            File.write((char *) &account, sizeof(Account));
            std::cout<<"\n\n\n\n\n\n\n\n\n\n\n\n\n\n\n                   \t\t\t\t\t      Record Updated..\n\n     \t\t\t\t\t                     ==>>Press Enter<<==";
            found=1;
        }
    }
    File.close();
    if(found==0)
        std::cout<<"\n\n Record Not Found ";
}